

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O1

void __thiscall xLearn::InmemReader::Initialize(InmemReader *this,string *filename)

{
  string *filename_00;
  InmemReader *pIVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  InmemReader *this_00;
  Modifier reset;
  Modifier green;
  Modifier local_64;
  undefined1 local_60 [32];
  string local_40;
  
  pIVar1 = (InmemReader *)(local_60 + 0x10);
  local_60._0_8_ = pIVar1;
  if (filename->_M_string_length != 0) {
    filename_00 = &(this->super_Reader).filename_;
    std::__cxx11::string::_M_assign((string *)filename_00);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,
               "First check if the text file has been already converted to binary format.","");
    local_40._M_dataplus._M_p._0_4_ = 0x20;
    local_64.code = RESET;
    poVar3 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[------------] ",0xf);
    poVar3 = Color::operator<<(poVar3,&local_64);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_60._0_8_,local_60._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    this_00 = (InmemReader *)local_60._0_8_;
    if ((InmemReader *)local_60._0_8_ != pIVar1) {
      operator_delete((void *)local_60._0_8_);
    }
    bVar2 = hash_binary(this_00,filename_00);
    if (bVar2) {
      StringPrintf_abi_cxx11_
                ((string *)local_60,"Binary file (%s.bin) found. Skip converting text to binary.",
                 (filename_00->_M_dataplus)._M_p);
      local_40._M_dataplus._M_p._0_4_ = 0x20;
      local_64.code = RESET;
      poVar3 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[------------] ",0xf);
      poVar3 = Color::operator<<(poVar3,&local_64);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_60._0_8_,local_60._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((InmemReader *)local_60._0_8_ != pIVar1) {
        operator_delete((void *)local_60._0_8_);
      }
      std::__cxx11::string::append((char *)filename_00);
      init_from_binary(this);
    }
    else {
      StringPrintf_abi_cxx11_
                ((string *)local_60,
                 "Binary file (%s.bin) NOT found. Convert text file to binary file.",
                 (filename_00->_M_dataplus)._M_p);
      local_40._M_dataplus._M_p._0_4_ = 0x20;
      local_64.code = RESET;
      poVar3 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[------------] ",0xf);
      poVar3 = Color::operator<<(poVar3,&local_64);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_60._0_8_,local_60._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((InmemReader *)local_60._0_8_ != pIVar1) {
        operator_delete((void *)local_60._0_8_);
      }
      pcVar4 = (char *)malloc((this->super_Reader).block_size_ << 0x14);
      (this->super_Reader).block_ = pcVar4;
      init_from_txt(this);
    }
    return;
  }
  local_64.code = 2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.cc"
             ,"");
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Initialize","");
  poVar3 = Logger::Start(ERR,(string *)local_60,0x7f,&local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK_NE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.cc"
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x7f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"filename.empty()",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"true",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)local_60);
  Logger::~Logger((Logger *)&local_64);
  abort();
}

Assistant:

void InmemReader::Initialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true)
  filename_ = filename;
  Color::print_info("First check if the text file has been already "
                    "converted to binary format.");
  // HashBinary() will read the first two hash value
  // and then check it whether equal to the hash value generated
  // by HashFile() function from current txt file.
  if (hash_binary(filename_)) {
    Color::print_info(
      StringPrintf("Binary file (%s.bin) found. "
                   "Skip converting text to binary.",
                   filename_.c_str())
    );
    filename_ += ".bin";
    init_from_binary();
  } else {
    Color::print_info(
      StringPrintf("Binary file (%s.bin) NOT found. Convert text "
                   "file to binary file.",
                   filename_.c_str())
    );
    // Allocate memory for block
    try {
      this->block_ = (char*)malloc(block_size_*1024*1024);
    } catch (std::bad_alloc&) {
      LOG(FATAL) << "Cannot allocate enough memory for data  \
                     block. Block size: " 
                 << block_size_ << "MB. "
                 << "You set change the block size via configuration.";
    }
    init_from_txt();
  }
}